

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_handle_possible_reconnect(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  ulong uVar3;
  uchar *puVar4;
  void *pvVar5;
  size_t sVar6;
  uchar *puVar7;
  char cVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uchar uVar12;
  int iVar13;
  ulong uVar14;
  uchar *unaff_R14;
  uchar *local_38;
  
  pmVar1 = ssl->conf;
  p_Var2 = pmVar1->f_cookie_write;
  if (pmVar1->f_cookie_check == (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0 ||
      p_Var2 == (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
    iVar13 = -0x7100;
  }
  else {
    uVar3 = ssl->in_left;
    iVar13 = -0x7900;
    if ((((((0x3c < uVar3) && (puVar4 = ssl->in_buf, *puVar4 == '\x16')) && (puVar4[3] == '\0')) &&
         ((puVar4[4] == '\0' && (puVar4[0x13] == '\0')))) &&
        ((puVar4[0x14] == '\0' &&
         ((puVar4[0x15] == '\0' && (uVar14 = (ulong)puVar4[0x3b], uVar14 <= uVar3 - 0x3d)))))) &&
       ((ulong)puVar4[uVar14 + 0x3c] <= uVar3 - 0x3c)) {
      pvVar5 = pmVar1->p_cookie;
      unaff_R14 = ssl->cli_id;
      sVar6 = ssl->cli_id_len;
      puVar7 = ssl->out_buf;
      iVar13 = (*pmVar1->f_cookie_check)
                         (pvVar5,puVar4 + uVar14 + 0x3d,(ulong)puVar4[uVar14 + 0x3c],unaff_R14,sVar6
                         );
      if (iVar13 == 0) {
        iVar13 = 0;
      }
      else {
        uVar9 = *(undefined8 *)puVar4;
        uVar10 = *(undefined8 *)(puVar4 + 8);
        uVar11 = *(undefined8 *)(puVar4 + 0x11);
        *(undefined8 *)(puVar7 + 9) = *(undefined8 *)(puVar4 + 9);
        *(undefined8 *)(puVar7 + 0x11) = uVar11;
        *(undefined8 *)puVar7 = uVar9;
        *(undefined8 *)(puVar7 + 8) = uVar10;
        puVar7[0xd] = '\x03';
        puVar7[0x19] = 0xfe;
        puVar7[0x1a] = 0xff;
        local_38 = puVar7 + 0x1c;
        iVar13 = (*p_Var2)(pvVar5,&local_38,puVar7 + 0x4000,unaff_R14,sVar6);
        if (iVar13 == 0) {
          unaff_R14 = local_38 + -(long)puVar7;
          cVar8 = (char)unaff_R14;
          puVar7[0x1b] = cVar8 + 0xe4;
          iVar13 = (int)unaff_R14;
          uVar12 = (uchar)((uint)(iVar13 + 0xffffe7) >> 0x10);
          puVar7[0x16] = uVar12;
          puVar7[0xe] = uVar12;
          uVar12 = (uchar)((uint)(iVar13 + 0xffe7) >> 8);
          puVar7[0x17] = uVar12;
          puVar7[0xf] = uVar12;
          puVar7[0x18] = cVar8 + 0xe7;
          puVar7[0x10] = cVar8 + 0xe7;
          puVar7[0xb] = (uchar)((uint)(iVar13 + 0xfff3) >> 8);
          puVar7[0xc] = cVar8 + 0xf3;
          iVar13 = -0x6a80;
        }
        else {
          iVar13 = -0x6c00;
        }
      }
    }
  }
  mbedtls_debug_print_ret
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xd63,"ssl_check_dtls_clihlo_cookie",iVar13);
  if (iVar13 == 0) {
    iVar13 = ssl_session_reset_int(ssl,1);
    if (iVar13 == 0) {
      iVar13 = -0x6780;
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xd74,"reset",iVar13);
    }
  }
  else if (iVar13 == -0x6a80) {
    (*ssl->f_send)(ssl->p_bio,ssl->out_buf,(size_t)unaff_R14);
    iVar13 = -0x6a80;
  }
  return iVar13;
}

Assistant:

static int ssl_handle_possible_reconnect( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t len;

    ret = ssl_check_dtls_clihlo_cookie(
            ssl->conf->f_cookie_write,
            ssl->conf->f_cookie_check,
            ssl->conf->p_cookie,
            ssl->cli_id, ssl->cli_id_len,
            ssl->in_buf, ssl->in_left,
            ssl->out_buf, MBEDTLS_SSL_MAX_CONTENT_LEN, &len );

    MBEDTLS_SSL_DEBUG_RET( 2, "ssl_check_dtls_clihlo_cookie", ret );

    if( ret == MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED )
    {
        /* Don't check write errors as we can't do anything here.
         * If the error is permanent we'll catch it later,
         * if it's not, then hopefully it'll work next time. */
        (void) ssl->f_send( ssl->p_bio, ssl->out_buf, len );

        return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
    }

    if( ret == 0 )
    {
        /* Got a valid cookie, partially reset context */
        if( ( ret = ssl_session_reset_int( ssl, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "reset", ret );
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_CLIENT_RECONNECT );
    }

    return( ret );
}